

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O1

void __thiscall Dialog::on_mouse_button_down(Dialog *this,ALLEGRO_MOUSE_EVENT *event)

{
  Widget *pWVar1;
  int iVar2;
  
  if (event->button == 1) {
    check_mouse_over(this,event->x,event->y);
    pWVar1 = this->mouse_over_widget;
    if (pWVar1 != (Widget *)0x0) {
      this->mouse_down_widget = pWVar1;
      (*pWVar1->_vptr_Widget[6])(pWVar1,(ulong)(uint)event->x,(ulong)(uint)event->y);
      pWVar1 = this->key_widget;
      if (this->mouse_down_widget != pWVar1) {
        if (pWVar1 != (Widget *)0x0) {
          (*pWVar1->_vptr_Widget[0xc])();
          this->key_widget = (Widget *)0x0;
        }
        iVar2 = (*this->mouse_down_widget->_vptr_Widget[10])();
        if ((char)iVar2 != '\0') {
          this->key_widget = this->mouse_down_widget;
          (*this->mouse_down_widget->_vptr_Widget[0xb])();
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void Dialog::on_mouse_button_down(const ALLEGRO_MOUSE_EVENT & event)
{
   if (event.button != 1)
      return;

   /* With touch input we may not receive mouse axes event before the touch
    * so we must check which widget the touch is over.
    */
   this->check_mouse_over(event.x, event.y);
   if (!this->mouse_over_widget)
      return;

   this->mouse_down_widget = this->mouse_over_widget;
   this->mouse_down_widget->on_mouse_button_down(event.x, event.y);

   /* transfer key focus */
   if (this->mouse_down_widget != this->key_widget) {
      if (this->key_widget) {
         this->key_widget->lost_key_focus();
         this->key_widget = NULL;
      }
      if (this->mouse_down_widget->want_key_focus()) {
         this->key_widget = this->mouse_down_widget;
         this->key_widget->got_key_focus();
      }
   }
}